

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

SIMDLoadStoreLane * __thiscall
wasm::Builder::makeSIMDLoadStoreLane
          (Builder *this,SIMDLoadStoreLaneOp op,Address offset,Address align,uint8_t index,
          Expression *ptr,Expression *vec,Name memory)

{
  SIMDLoadStoreLane *this_00;
  
  this_00 = MixedArena::alloc<wasm::SIMDLoadStoreLane>(&this->wasm->allocator);
  this_00->op = op;
  (this_00->offset).addr = offset.addr;
  (this_00->align).addr = align.addr;
  this_00->index = index;
  this_00->ptr = ptr;
  this_00->vec = vec;
  SIMDLoadStoreLane::finalize(this_00);
  (this_00->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
  (this_00->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
  return this_00;
}

Assistant:

SIMDLoadStoreLane* makeSIMDLoadStoreLane(SIMDLoadStoreLaneOp op,
                                           Address offset,
                                           Address align,
                                           uint8_t index,
                                           Expression* ptr,
                                           Expression* vec,
                                           Name memory) {
    auto* ret = wasm.allocator.alloc<SIMDLoadStoreLane>();
    ret->op = op;
    ret->offset = offset;
    ret->align = align;
    ret->index = index;
    ret->ptr = ptr;
    ret->vec = vec;
    ret->finalize();
    ret->memory = memory;
    return ret;
  }